

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  string *name;
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  cmTarget *pcVar3;
  pointer pcVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_1b0;
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  if ((this->Name)._M_string_length == 0) {
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"not given name for TARGET scope.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_190);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
LAB_0026b855:
    bVar1 = false;
  }
  else {
    name = &this->Name;
    iVar2 = std::__cxx11::string::compare((char *)&this->PropertyName);
    this_00 = (this->super_cmCommand).Makefile;
    if (iVar2 == 0) {
      bVar1 = cmMakefile::IsAlias(this_00,name);
      if (bVar1) {
        pcVar3 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name,false);
        if (pcVar3 != (cmTarget *)0x0) {
          pcVar4 = (pcVar3->Name)._M_dataplus._M_p;
          goto LAB_0026b757;
        }
      }
      pcVar4 = (this->Variable)._M_dataplus._M_p;
      local_190._0_8_ = local_190 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar4,pcVar4 + (this->Variable)._M_string_length);
      std::__cxx11::string::append((char *)local_190);
      StoreResult(this,(char *)local_190._0_8_);
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
      }
    }
    else {
      pcVar3 = cmMakefile::FindTargetToUse(this_00,name,false);
      if (pcVar3 == (cmTarget *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"could not find TARGET ",0x16);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_190,(this->Name)._M_dataplus._M_p,
                            (this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,".  Perhaps it has not yet been created.",0x27);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
        std::ios_base::~ios_base(local_120);
        goto LAB_0026b855;
      }
      pcVar4 = cmTarget::GetProperty(pcVar3,&this->PropertyName,(this->super_cmCommand).Makefile);
LAB_0026b757:
      StoreResult(this,pcVar4);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for TARGET scope.");
    return false;
    }

  if(this->PropertyName == "ALIASED_TARGET")
    {
    if(this->Makefile->IsAlias(this->Name))
      {
      if(cmTarget* target =
                          this->Makefile->FindTargetToUse(this->Name))
        {
        return this->StoreResult(target->GetName().c_str());
        }
      }
    return this->StoreResult((this->Variable + "-NOTFOUND").c_str());
    }
  if(cmTarget* target = this->Makefile->FindTargetToUse(this->Name))
    {
    return this->StoreResult(target->GetProperty(this->PropertyName,
                                                 this->Makefile));
    }
  else
    {
    std::ostringstream e;
    e << "could not find TARGET " << this->Name
      << ".  Perhaps it has not yet been created.";
    this->SetError(e.str());
    return false;
    }
}